

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  undefined4 in_register_00000034;
  uint32_t *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  int local_5c;
  secp256k1_scalar s;
  
  puVar7 = (uint32_t *)CONCAT44(in_register_00000034,len);
  s.d._0_8_ = *(undefined8 *)puVar7;
  s.d._8_8_ = *(undefined8 *)(puVar7 + 2);
  s.d._16_8_ = *(undefined8 *)(puVar7 + 4);
  s.d._24_8_ = *(undefined8 *)(puVar7 + 6);
  iVar14 = 0;
  memset(wnaf,0,0x400);
  if ((long)s.d._24_8_ < 0) {
    secp256k1_scalar_negate(&s,&s);
    local_5c = -1;
  }
  else {
    local_5c = 1;
  }
  iVar3 = (int)a;
  uVar9 = 0;
  uVar4 = 0xffffffff;
  do {
    iVar6 = iVar14 + -0x100;
    iVar10 = 0x100 - iVar14;
    iVar12 = iVar14 + -1;
    piVar11 = wnaf + iVar14;
    while( true ) {
      uVar1 = iVar6 + 0x100;
      if (0xff < (int)uVar1) {
        return uVar4 + 1;
      }
      uVar8 = uVar1 >> 5;
      uVar13 = s.d[uVar8] >> ((byte)uVar1 & 0x1f);
      if ((uVar13 & 1) != uVar9) break;
      iVar14 = iVar14 + 1;
      iVar6 = iVar6 + 1;
      iVar10 = iVar10 + -1;
      iVar12 = iVar12 + 1;
      piVar11 = piVar11 + 1;
    }
    bVar5 = (byte)-iVar6;
    if (iVar3 <= -iVar6) {
      bVar5 = (byte)a;
    }
    iVar6 = iVar10;
    if (iVar3 < iVar10) {
      iVar6 = iVar3;
    }
    if ((uint)(iVar6 + iVar12) >> 5 != uVar8) {
      bVar2 = (byte)uVar1 & 0x1f;
      uVar13 = s.d[uVar8] >> bVar2 | s.d[(ulong)uVar8 + 1] << 0x20 - bVar2;
    }
    uVar4 = (~(-1 << (bVar5 & 0x1f)) & uVar13) + uVar9;
    bVar15 = (uVar4 >> (iVar3 - 1U & 0x1f) & 1) != 0;
    uVar9 = (uint)bVar15;
    if (iVar3 < iVar10) {
      iVar10 = iVar3;
    }
    *piVar11 = (uVar4 - ((uint)bVar15 << ((byte)a & 0x1f))) * local_5c;
    iVar14 = iVar10 + iVar14;
    uVar4 = uVar1;
  } while( true );
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s = *a;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}